

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

void __thiscall compiler::CompilerAstWalker::loadVariable(CompilerAstWalker *this,string *str)

{
  element_type *peVar1;
  pointer pCVar2;
  size_t __n;
  size_t sVar3;
  pointer *ppVVar4;
  bool bVar5;
  int iVar6;
  ClosureContext *cc;
  pointer pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  long lVar8;
  size_t sVar9;
  ByteCode bc;
  ByteCode bc_00;
  ByteCode bc_01;
  size_t local_90;
  size_t index;
  size_t index_1;
  ClosureContext cc_1;
  shared_ptr<compiler::EmissionContext> ec;
  
  ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str;
  bVar5 = EmissionContext::GetDeclarationIndex
                    ((this->ec).
                     super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,str,&local_90,false);
  if (bVar5) {
    bc.parameter = local_90;
    bc._0_8_ = 0xf;
    EmissionContext::EmitByteCode
              ((this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,bc);
  }
  else {
    peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pCVar7 = (peVar1->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (peVar1->closures).
             super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar7 != pCVar2) {
      sVar9 = 0;
      do {
        __n = (pCVar7->value)._M_string_length;
        sVar3._0_4_ = (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count;
        sVar3._4_4_ = (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_weak_count;
        if (__n == sVar3) {
          if (__n == 0) {
            bVar5 = true;
          }
          else {
            iVar6 = bcmp((pCVar7->value)._M_dataplus._M_p,
                         (ec.
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base,__n);
            bVar5 = iVar6 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          bc_00.parameter = sVar9;
          bc_00._0_8_ = 0x28;
          EmissionContext::EmitByteCode
                    ((this->ec).
                     super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,bc_00);
          return;
        }
        sVar9 = sVar9 + 1;
        pCVar7 = pCVar7 + 1;
      } while (pCVar7 != pCVar2);
    }
    peVar1 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    cc_1.localScopeIndex =
         (size_t)(peVar1->outerContext).
                 super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (peVar1->outerContext).
         super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppVVar4 = (pointer *)
                  ((long)&((ec.
                            super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->variables).
                          super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                          ._M_impl.super__Vector_impl_data + 8);
        *(int *)ppVVar4 = *(int *)ppVVar4 + 1;
        UNLOCK();
      }
      else {
        ppVVar4 = (pointer *)
                  ((long)&((ec.
                            super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->variables).
                          super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                          ._M_impl.super__Vector_impl_data + 8);
        *(int *)ppVVar4 = *(int *)ppVVar4 + 1;
      }
    }
    lVar8 = 1;
    do {
      sVar9 = cc_1.localScopeIndex;
      index_1 = (size_t)&cc_1.value._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&index_1,
                 "Emission context was nullptr when we expected one in resolving closure","");
      Error::assertWithPanic(sVar9 != 0,(string *)&index_1);
      if ((size_type *)index_1 != &cc_1.value._M_string_length) {
        operator_delete((void *)index_1,
                        CONCAT71(cc_1.value._M_string_length._1_7_,
                                 (undefined1)cc_1.value._M_string_length) + 1);
      }
      bVar5 = EmissionContext::GetDeclarationIndex
                        ((EmissionContext *)cc_1.localScopeIndex,
                         (string *)
                         ec.
                         super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi,&index,true);
      if (bVar5) {
        index_1 = (size_t)&cc_1.value._M_string_length;
        cc_1.value._M_dataplus._M_p = (pointer)0x0;
        cc_1.value._M_string_length._0_1_ = 0;
        std::__cxx11::string::_M_assign((string *)&index_1);
        cc_1.outerScopeCount = index;
        peVar1 = (this->ec).
                 super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pCVar7 = (peVar1->closures).
                 super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pCVar2 = (peVar1->closures).
                 super__Vector_base<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        cc_1.value.field_2._8_8_ = lVar8;
        std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::push_back
                  (&peVar1->closures,(value_type *)&index_1);
        bc_01.parameter = ((long)pCVar2 - (long)pCVar7 >> 4) * -0x5555555555555555;
        bc_01._0_8_ = 0x28;
        EmissionContext::EmitByteCode
                  ((this->ec).
                   super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   bc_01);
        if ((size_type *)index_1 != &cc_1.value._M_string_length) {
          operator_delete((void *)index_1,
                          CONCAT71(cc_1.value._M_string_length._1_7_,
                                   (undefined1)cc_1.value._M_string_length) + 1);
        }
      }
      else {
        __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(cc_1.localScopeIndex + 0x70);
        cc_1.localScopeIndex = *(size_t *)(cc_1.localScopeIndex + 0x68);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec,__r);
        lVar8 = lVar8 + 1;
      }
    } while (!bVar5);
    if (ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ec.super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
  }
  return;
}

Assistant:

void loadVariable(const std::string& str) noexcept {
    std::size_t index;
    if (this->ec->GetDeclarationIndex(str, index, false)) {
      // it's a local
      this->emit(bytecode::ByteCodeInstruction::LoadLocal, index);
    } else {
      // it's a closure
      std::size_t i = 0;
      for (const auto& cc : this->ec->closures) {
        if (cc.value == str) {
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, i);
          return;
        }
        i++;
      }
      // if we've gotten to this point, we need to add a new closure
      std::size_t localOffsets = 1;
      auto ec = this->ec->outerContext;

      while (true) {
        Error::assertWithPanic(ec != nullptr, "Emission context was nullptr when we expected one in resolving closure");
        std::size_t index;
        if (ec->GetDeclarationIndex(str, index, true)) {
          ClosureContext cc;
          cc.value = str;
          cc.outerScopeCount = localOffsets;
          cc.localScopeIndex = index;
          std::size_t closureIndex = this->ec->closures.size();
          this->ec->closures.push_back(cc);
          this->emit(bytecode::ByteCodeInstruction::LoadClosure, closureIndex);
          return;
        }
        ec = ec->outerContext;
        localOffsets++;
      }
    }
  }